

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O3

void data_pipeline_1P(size_t L,uint w,PipeType type)

{
  U *pUVar1;
  element_type *peVar2;
  int *piVar3;
  _func_void *p_Var4;
  Topology *pTVar5;
  _Head_base<0UL,_tf::Node_*,_false> _Var6;
  bool bVar7;
  char cVar8;
  void *pvVar9;
  void *__s;
  size_t *psVar10;
  ulong uVar11;
  long *plVar12;
  Node *pNVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ulong uVar15;
  size_t sVar16;
  value_type_conflict3 *__val;
  pointer *__ptr;
  char cVar17;
  _func_void *p_Var18;
  undefined8 uVar19;
  long lVar20;
  long in_FS_OFFSET;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  promise<void> promise;
  string __str;
  vector<int,_std::allocator<int>_> source;
  size_t j;
  Task test;
  Task datapipeline;
  Taskflow taskflow;
  Executor executor;
  future<void> local_3c8;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [18];
  undefined1 uStack_396;
  undefined1 uStack_395;
  undefined4 uStack_394;
  __basic_future<void> local_388;
  _Any_data local_378;
  size_t local_360;
  _Any_data local_358;
  undefined1 local_348 [16];
  long local_338;
  ulong local_328;
  undefined8 local_320;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  local_318;
  undefined8 local_300;
  int local_2f8;
  ulong local_2f0;
  _func_void *local_2e8;
  undefined8 *local_2e0;
  undefined1 *local_2d8;
  int local_2d0;
  undefined1 local_2c8 [16];
  void *local_2b8;
  vector<tf::Task,_std::allocator<tf::Task>_> local_2b0;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_298;
  vector<tf::CachelineAligned<std::variant<std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<std::monostate>_>_>_>
  local_280;
  size_type local_268;
  ulong local_260;
  _Head_base<0UL,_tf::Node_*,_false> local_258;
  _Head_base<0UL,_tf::Node_*,_false> local_250;
  __shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2> local_248;
  undefined1 local_230 [80];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  _Map_pointer local_180;
  bool local_170;
  Executor local_168;
  
  local_248._M_ptr = (element_type *)0x0;
  local_248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_358._12_4_ = type;
  tf::Executor::Executor(&local_168,(ulong)w,(shared_ptr<tf::WorkerInterface> *)&local_248);
  local_360 = L;
  if (local_248._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_refcount._M_pi);
  }
  local_348 = (undefined1  [16])0x0;
  local_338 = 0;
  pvVar9 = operator_new(400);
  local_348._0_8_ = pvVar9;
  lVar20 = 0;
  local_338 = (long)pvVar9 + 400;
  memset(pvVar9,0,400);
  local_348._8_8_ = (long)pvVar9 + 400;
  iVar21 = 0;
  iVar22 = 1;
  iVar23 = 2;
  iVar24 = 3;
  do {
    piVar3 = (int *)((long)pvVar9 + lVar20 * 4);
    *piVar3 = iVar21;
    piVar3[1] = iVar22;
    piVar3[2] = iVar23;
    piVar3[3] = iVar24;
    lVar20 = lVar20 + 4;
    iVar21 = iVar21 + 4;
    iVar22 = iVar22 + 4;
    iVar23 = iVar23 + 4;
    iVar24 = iVar24 + 4;
  } while (lVar20 != 100);
  local_358._M_unused._M_object = (void *)0x0;
  uVar11 = local_360 * 8;
  local_268 = local_360 + 1;
  pTVar5 = (Topology *)(local_3a8 + 0x10);
  local_260 = local_360 >> 0x3c;
  sVar16 = local_360;
  local_328 = uVar11;
  do {
    if (local_358._12_4_ == SERIAL) {
      local_230._0_8_ = local_1e0;
      local_230._40_8_ = (__pthread_internal_list *)0x0;
      local_230._24_16_ = (undefined1  [16])0x0;
      local_230._8_16_ = (undefined1  [16])0x0;
      local_230._48_8_ = local_230 + 0x40;
      local_230._56_8_ = 0;
      local_230[0x40] = '\0';
      local_180 = (_Map_pointer)0x0;
      local_190 = (undefined1  [16])0x0;
      local_1a0 = (undefined1  [16])0x0;
      local_1b0 = (undefined1  [16])0x0;
      local_1c0 = (undefined1  [16])0x0;
      local_1d0 = (undefined1  [16])0x0;
      local_1e0 = (undefined1  [16])0x0;
      std::
      _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                         *)(local_1d0 + 8),0);
      local_170 = false;
      local_320 = 0;
      local_318.
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_318.
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2f8 = 2;
      local_2e8 = (_func_void *)local_358._M_unused._0_8_;
      local_2e0 = &local_320;
      local_2d8 = local_348;
      local_2d0 = 2;
      local_2f0 = sVar16;
      if (local_260 != 0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      local_2c8 = (undefined1  [16])0x0;
      local_2b8 = (void *)0x0;
      if (sVar16 == 0) {
        local_2c8._0_8_ = 0;
        pvVar9 = (void *)0x0;
        local_2c8._8_8_ = 0;
      }
      else {
        __s = operator_new(uVar11);
        local_2c8._0_8_ = __s;
        pvVar9 = (void *)((long)__s + sVar16 * 8);
        memset(__s,0,uVar11);
        local_2c8._8_8_ = (long)__s + uVar11;
      }
      local_2b8 = pvVar9;
      std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
                (&local_2b0,local_268,(allocator_type *)&local_3c8);
      sVar16 = local_360;
      std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
                (&local_298,local_360,(allocator_type *)&local_3c8);
      std::
      vector<tf::CachelineAligned<std::variant<std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<std::monostate>_>_>_>
      ::vector(&local_280,sVar16,(allocator_type *)&local_3c8);
      if (sVar16 == 0) {
        tf::throw_re<char_const(&)[28]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                   ,0x180,(char (*) [28])"must have at least one line");
      }
      if (local_2f8 != 2) {
        tf::throw_re<char_const(&)[26]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                   ,0x184,(char (*) [26])"first pipe must be serial");
      }
      local_300 = 0;
      if ((long)local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar20 = ((long)local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        psVar10 = &(local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                    _M_impl.super__Vector_impl_data._M_start)->_pipe;
        sVar16 = 0;
        do {
          *psVar10 = 0;
          ((Pipeflow *)(psVar10 + -1))->_line = sVar16;
          sVar16 = sVar16 + 1;
          psVar10 = psVar10 + 0xc;
        } while (lVar20 + (ulong)(lVar20 == 0) != sVar16);
      }
      *(undefined8 *)local_2c8._0_8_ = 0;
      if (1 < (ulong)(((long)local_298.
                             super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_298.
                             super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl
                             .super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
        uVar11 = 1;
        do {
          *(long *)(local_2c8._0_8_ + uVar11 * 8) = (long)local_2d0 + -1;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)(((long)local_298.
                                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_298.
                                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                 -0x5555555555555555));
      }
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0xd8);
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_nstate = 0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_estate = (__atomic_base<int>)0x0;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name)._M_dataplus._M_p =
           (pointer)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_name).field_2;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name)._M_string_length = 0;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
      pUVar1 = &(((Node *)local_3c8.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_data = (void *)0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_topology = (Topology *)0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_parent = (Node *)0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_num_successors = 0;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           &((Node *)local_3c8.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_join_counter;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
      *(undefined8 *)
       ((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 8) = 0;
      *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        **)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_handle).
            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                     *)&local_318;
      *(code **)((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_handle).
                        super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                + 0x18) =
           std::
           _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
           ::_M_invoke;
      *(code **)((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_handle).
                        super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                + 0x10) =
           std::
           _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
           ::_M_manager;
      *(__index_type *)
       ((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) = '\x04';
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_semaphores =
           (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
            )0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_exception_ptr = (void *)0x0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_318,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3c8);
      if ((Node *)local_3c8.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (Node *)0x0) {
        std::default_delete<tf::Node>::operator()
                  ((default_delete<tf::Node> *)&local_3c8,
                   (Node *)local_3c8.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
      }
      pNVar13 = local_318.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
      local_3b8._0_5_ = 0x646e6f63;
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3b8;
      std::__cxx11::string::_M_assign((string *)&pNVar13->_name);
      (local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
       super__Vector_impl_data._M_start)->_node = pNVar13;
      if (local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)local_3b8) {
        operator_delete(local_3c8.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_3b8._0_8_ + 1);
      }
      if (local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_298.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(0xd8);
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_nstate = 0;
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_estate = (__atomic_base<int>)0x0;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_name)._M_dataplus._M_p =
               (pointer)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name).field_2;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_name)._M_string_length = 0;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_name).field_2._M_local_buf[0] = '\0';
          pUVar1 = &(((Node *)local_3c8.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_data = (void *)0x0;
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_topology = (Topology *)0x0;
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_parent = (Node *)0x0;
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_num_successors = 0;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
          super_SmallVectorTemplateBase<tf::Node_*,_true>.
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
          super_SmallVectorTemplateBase<tf::Node_*,_true>.
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
          super_SmallVectorTemplateBase<tf::Node_*,_true>.
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
               &((Node *)local_3c8.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_join_counter;
          (((Node *)local_3c8.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
          *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
            **)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_handle).
                super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                .
                super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                .
                super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                .
                super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                .
                super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                .
                super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                         *)&local_318;
          *(ulong *)((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_handle).
                            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    + 8) = uVar11;
          *(code **)((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_handle).
                            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    + 0x18) =
               std::
               _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
               ::_M_invoke;
          *(code **)((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_handle).
                            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    + 0x10) =
               std::
               _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
               ::_M_manager;
          *(__index_type *)
           ((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_handle).
                   super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           + 0x38) = '\x02';
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_semaphores =
               (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
                )0x0;
          ((Node *)local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_exception_ptr = (void *)0x0;
          std::
          vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
          ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                    ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                      *)&local_318,
                     (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3c8);
          if ((Node *)local_3c8.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != (Node *)0x0) {
            std::default_delete<tf::Node>::operator()
                      ((default_delete<tf::Node> *)&local_3c8,
                       (Node *)local_3c8.super___basic_future<void>._M_state.
                               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          }
          pNVar13 = local_318.
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                    super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                    super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                    super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
          uStack_396 = 0x2d;
          local_3a8._16_2_ = 0x7472;
          local_3a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
          uStack_395 = 0;
          cVar17 = '\x01';
          if (9 < uVar11) {
            uVar15 = uVar11;
            cVar8 = '\x04';
            do {
              cVar17 = cVar8;
              if (uVar15 < 100) {
                cVar17 = cVar17 + -2;
                goto LAB_0011bec1;
              }
              if (uVar15 < 1000) {
                cVar17 = cVar17 + -1;
                goto LAB_0011bec1;
              }
              if (uVar15 < 10000) goto LAB_0011bec1;
              bVar7 = 99999 < uVar15;
              uVar15 = uVar15 / 10000;
              cVar8 = cVar17 + '\x04';
            } while (bVar7);
            cVar17 = cVar17 + '\x01';
          }
LAB_0011bec1:
          local_388._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_378;
          local_3a8._0_8_ = pTVar5;
          std::__cxx11::string::_M_construct((ulong)&local_388,cVar17);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_388._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,
                     (uint)local_388._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,uVar11);
          p_Var18 = (_func_void *)0xf;
          if ((Topology *)local_3a8._0_8_ != pTVar5) {
            p_Var18 = (_func_void *)
                      CONCAT44(uStack_394,CONCAT13(uStack_395,CONCAT12(uStack_396,local_3a8._16_2_))
                              );
          }
          p_Var4 = (_func_void *)
                   ((long)(_func_int ***)local_3a8._8_8_ +
                   CONCAT44(local_388._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_,
                            (uint)local_388._M_state.
                                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi));
          if (p_Var18 < p_Var4) {
            uVar19 = (_func_void *)0xf;
            if ((_Any_data *)
                local_388._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != &local_378) {
              uVar19 = local_378._M_unused._0_8_;
            }
            if ((ulong)uVar19 < p_Var4) goto LAB_0011bf2f;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_388,0,(char *)0x0,local_3a8._0_8_);
          }
          else {
LAB_0011bf2f:
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        (local_3a8,
                                         (ulong)local_388._M_state.
                                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr);
          }
          local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_3b8;
          peVar2 = (element_type *)(plVar12 + 2);
          if ((element_type *)*plVar12 == peVar2) {
            local_3b8._0_8_ = peVar2->_vptr__State_baseV2;
            local_3b8._8_8_ = peVar2->_M_result;
          }
          else {
            local_3b8._0_8_ = peVar2->_vptr__State_baseV2;
            local_3c8.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)*plVar12;
          }
          local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar12[1];
          *plVar12 = (long)peVar2;
          plVar12[1] = 0;
          *(undefined1 *)&peVar2->_vptr__State_baseV2 = 0;
          std::__cxx11::string::_M_assign((string *)&pNVar13->_name);
          local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11 + 1]._node = pNVar13;
          if (local_3c8.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)local_3b8) {
            operator_delete(local_3c8.super___basic_future<void>._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,local_3b8._0_8_ + 1);
          }
          if ((_Any_data *)
              local_388._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != &local_378) {
            operator_delete(local_388._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)(local_378._M_unused._M_member_pointer + 1));
          }
          if ((Topology *)local_3a8._0_8_ != pTVar5) {
            operator_delete((void *)local_3a8._0_8_,
                            CONCAT44(uStack_394,
                                     CONCAT13(uStack_395,CONCAT12(uStack_396,local_3a8._16_2_))) + 1
                           );
          }
          uVar11 = uVar11 + 1;
          tf::Task::precede<tf::Task&>
                    (local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar11);
        } while (uVar11 < (ulong)(((long)local_298.
                                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_298.
                                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                 -0x5555555555555555));
      }
      uVar19 = local_230._0_8_;
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0xd8);
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_nstate = 0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_estate = (__atomic_base<int>)0x0;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name)._M_dataplus._M_p =
           (pointer)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_name).field_2;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name)._M_string_length = 0;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
      pUVar1 = &(((Node *)local_3c8.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_data = (void *)0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_topology = (Topology *)0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_parent = (Node *)0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_num_successors = 0;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           &((Node *)local_3c8.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_join_counter;
      (((Node *)local_3c8.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
      *(vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        **)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_handle).
            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            .
            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            ._M_u = &local_318;
      *(__index_type *)
       ((long)&(((Node *)local_3c8.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) = '\x06';
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_semaphores =
           (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
            )0x0;
      ((Node *)local_3c8.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_exception_ptr = (void *)0x0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)uVar19,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3c8);
      if ((Node *)local_3c8.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (Node *)0x0) {
        std::default_delete<tf::Node>::operator()
                  ((default_delete<tf::Node> *)&local_3c8,
                   (Node *)local_3c8.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
      }
      _Var6._M_head_impl =
           (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              *)uVar19)->
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3c8,"module_of_datapipeline","");
      std::__cxx11::string::_M_assign((string *)&(_Var6._M_head_impl)->_name);
      local_250._M_head_impl = _Var6._M_head_impl;
      if (local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)local_3b8) {
        operator_delete(local_3c8.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_3b8._0_8_ + 1);
      }
      uVar19 = local_230._0_8_;
      pNVar13 = (Node *)operator_new(0xd8);
      pNVar13->_nstate = 0;
      pNVar13->_estate = (__atomic_base<int>)0x0;
      (pNVar13->_name)._M_dataplus._M_p = (pointer)&(pNVar13->_name).field_2;
      (pNVar13->_name)._M_string_length = 0;
      (pNVar13->_name).field_2._M_local_buf[0] = '\0';
      pUVar1 = &(pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
      pNVar13->_data = (void *)0x0;
      pNVar13->_topology = (Topology *)0x0;
      pNVar13->_parent = (Node *)0x0;
      pNVar13->_num_successors = 0;
      (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
      (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
      (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           &pNVar13->_join_counter;
      *(undefined1 (*) [16])&pNVar13->_join_counter = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&(pNVar13->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 8) = (undefined1  [16])0x0;
      *(undefined8 *)
       ((long)&(pNVar13->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x18) = 0;
      plVar12 = (long *)operator_new(0x18);
      *plVar12 = (long)&local_320;
      plVar12[1] = (long)&local_358;
      plVar12[2] = (long)&local_318;
      *(long **)&(pNVar13->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 ._M_u = plVar12;
      *(code **)((long)&(pNVar13->_handle).
                        super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                + 0x18) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:42:36)>
           ::_M_invoke;
      *(code **)((long)&(pNVar13->_handle).
                        super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        .
                        super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                + 0x10) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:42:36)>
           ::_M_manager;
      *(__index_type *)
       ((long)&(pNVar13->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) = '\x01';
      pNVar13->_semaphores =
           (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
            )0x0;
      pNVar13->_exception_ptr = (void *)0x0;
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pNVar13;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)uVar19,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3c8);
      uVar11 = local_328;
      if ((Node *)local_3c8.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (Node *)0x0) {
        std::default_delete<tf::Node>::operator()
                  ((default_delete<tf::Node> *)&local_3c8,
                   (Node *)local_3c8.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
      }
      _Var6._M_head_impl =
           (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              *)uVar19)->
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      local_3c8.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"test","");
      std::__cxx11::string::_M_assign((string *)&(_Var6._M_head_impl)->_name);
      local_258._M_head_impl = _Var6._M_head_impl;
      if (local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)local_3b8) {
        operator_delete(local_3c8.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_3b8._0_8_ + 1);
      }
      tf::Task::precede<tf::Task&>((Task *)&local_250,(Task *)&local_258);
      sVar16 = local_360;
      iVar21 = pthread_mutex_lock((pthread_mutex_t *)&local_168._topology_mutex);
      if (iVar21 != 0) {
        std::__throw_system_error(iVar21);
      }
      local_168._num_topologies = local_168._num_topologies + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&local_168._topology_mutex);
      if (local_1e0._0_8_ == local_1e0._8_8_) {
        std::promise<void>::promise((promise<void> *)local_3a8);
        std::promise<void>::set_value((promise<void> *)local_3a8);
        iVar21 = pthread_mutex_lock((pthread_mutex_t *)&local_168._topology_mutex);
        if (iVar21 != 0) {
          std::__throw_system_error(iVar21);
        }
        local_168._num_topologies = local_168._num_topologies - 1;
        if (local_168._num_topologies == 0) {
          std::condition_variable::notify_all();
        }
        pthread_mutex_unlock((pthread_mutex_t *)&local_168._topology_mutex);
        std::__basic_future<void>::__basic_future(&local_388,(__state_type *)local_3a8);
        local_3c8.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(local_388._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_,
                      (uint)local_388._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        local_3c8.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_388._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_3b8 = (undefined1  [16])0x0;
        std::promise<void>::~promise((promise<void> *)local_3a8);
      }
      else {
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
        p_Var14->_M_use_count = 1;
        p_Var14->_M_weak_count = 1;
        p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00180c98;
        p_Var14[1]._vptr__Sp_counted_base = (_func_int **)local_230;
        std::promise<void>::promise((promise<void> *)&p_Var14[1]._M_use_count);
        *(undefined4 *)&p_Var14[3]._vptr__Sp_counted_base = 2;
        p_Var14[3]._M_use_count = 0;
        p_Var14[3]._M_weak_count = 0;
        *(code **)&p_Var14[4]._M_use_count =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:49:36)>
             ::_M_invoke;
        p_Var14[4]._vptr__Sp_counted_base =
             (_func_int **)
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:49:36)>
             ::_M_manager;
        p_Var14[5]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var14[5]._M_use_count = 0;
        p_Var14[5]._M_weak_count = 0;
        *(code **)&p_Var14[6]._M_use_count =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2018:46)>
             ::_M_invoke;
        p_Var14[6]._vptr__Sp_counted_base =
             (_func_int **)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2018:46)>
             ::_M_manager;
        p_Var14[7]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var14[7]._M_use_count = 0;
        p_Var14[8]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_3a8._0_8_ = (Topology *)(p_Var14 + 1);
        local_3a8._8_8_ = p_Var14;
        std::__basic_future<void>::__basic_future
                  (&local_388,(__state_type *)&p_Var14[1]._M_use_count);
        uVar11 = local_328;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_weak_count = p_Var14->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_weak_count = p_Var14->_M_weak_count + 1;
        }
        local_3c8.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(local_388._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_,
                      (uint)local_388._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        local_3c8.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_388._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_3b8._8_8_ = p_Var14;
        local_3b8._0_8_ = (Topology *)(p_Var14 + 1);
        iVar21 = pthread_mutex_lock((pthread_mutex_t *)(local_230 + 8));
        if (iVar21 != 0) {
          std::__throw_system_error(iVar21);
        }
        std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
        push_back((deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                   *)(local_1d0 + 8),(value_type *)local_3a8);
        sVar16 = local_360;
        if (((long)(local_1b0._8_8_ - local_1c0._8_8_) >> 4) +
            ((long)(local_1a0._8_8_ - local_190._0_8_) >> 4) +
            ((((ulong)((long)local_180 - local_1a0._0_8_) >> 3) - 1) +
            (ulong)(local_180 == (_Map_pointer)0x0)) * 0x20 == 1) {
          tf::Executor::_set_up_topology
                    (&local_168,*(Worker **)(in_FS_OFFSET + -8),(Topology *)local_3a8._0_8_);
        }
        pthread_mutex_unlock((pthread_mutex_t *)(local_230 + 8));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
        }
      }
      std::future<void>::get(&local_3c8);
      if ((__uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
           )local_3b8._8_8_ !=
          (__uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
           )0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar3 = (int *)(local_3b8._8_8_ + 0xc);
          iVar21 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
        }
        else {
          iVar21 = *(int *)(local_3b8._8_8_ + 0xc);
          *(int *)(local_3b8._8_8_ + 0xc) = iVar21 + -1;
        }
        if (iVar21 == 1) {
          (**(code **)(*(long *)local_3b8._8_8_ + 0x18))();
        }
      }
      if (local_3c8.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3c8.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_280.
          super__Vector_base<tf::CachelineAligned<std::variant<std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<std::monostate>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.
                        super__Vector_base<tf::CachelineAligned<std::variant<std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<std::monostate>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_280.
                              super__Vector_base<tf::CachelineAligned<std::variant<std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<std::monostate>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_280.
                              super__Vector_base<tf::CachelineAligned<std::variant<std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<std::monostate>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,0x80);
      }
      std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::~vector(&local_298);
      if (local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
          super__Vector_impl_data._M_start != (Task *)0x0) {
        operator_delete(local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_2c8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_2c8._0_8_,(long)local_2b8 - local_2c8._0_8_);
      }
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::~vector(&local_318);
      tf::Taskflow::~Taskflow((Taskflow *)local_230);
    }
    local_358._M_unused._0_8_ = (undefined8)(local_358._M_unused._M_member_pointer + 1);
    if ((_func_void *)0x64 < local_358._M_unused._M_object) {
      if ((void *)local_348._0_8_ != (void *)0x0) {
        operator_delete((void *)local_348._0_8_,local_338 - local_348._0_8_);
      }
      tf::Executor::~Executor(&local_168);
      return;
    }
  } while( true );
}

Assistant:

void data_pipeline_1P(size_t L, unsigned w, tf::PipeType type) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);

  // iterate different data amount (1, 2, 3, 4, 5, ... 1000000)
  for (size_t N = 0; N <= maxN; N++) {

    // serial direction
    if (type == tf::PipeType::SERIAL) {
      tf::Taskflow taskflow;
      size_t j = 0;
      tf::DataPipeline pl (L, tf::make_data_pipe<tf::Pipeflow&, void>(type, [L, N, &j, &source](auto& pf) mutable {
        if (j == N) {
          pf.stop();
          return;
        }
        REQUIRE(j == source[j]);
        REQUIRE(pf.token() % L == pf.line());
        j++;
      }));

      auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");

      auto test = taskflow.emplace([&](){
        REQUIRE(j == N);
        REQUIRE(pl.num_tokens() == N);
      }).name("test");

      datapipeline.precede(test);

      executor.run_until(taskflow, [counter=3, j]() mutable{
        j = 0;
        return counter --== 0;
      }).get();
    }
  }
}